

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyFullClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,Options *options)

{
  string classname;
  string php_namespace;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  LegacyGeneratedClassName<google::protobuf::Descriptor>(&local_78,desc);
  RootPhpNamespace<google::protobuf::Descriptor>(&local_58,desc,options);
  if (local_58._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    std::operator+(&local_38,&local_58,"\\");
    std::operator+(__return_storage_ptr__,&local_38,&local_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyFullClassName(const DescriptorType* desc,
                                const Options& options) {
  std::string classname = LegacyGeneratedClassName(desc);
  std::string php_namespace = RootPhpNamespace(desc, options);
  if (!php_namespace.empty()) {
    return php_namespace + "\\" + classname;
  }
  return classname;
}